

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Opnd * __thiscall
Lowerer::GenerateArgOutForInlineeStackArgs(Lowerer *this,Instr *callInstr,Instr *stackArgsInstr)

{
  ushort uVar1;
  Func *this_00;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  SymOpnd *pSVar5;
  StackSym *stackSym;
  RegOpnd *dst;
  IndirOpnd *newSrc;
  Instr *this_01;
  IntConstOpnd *pIVar6;
  int offset;
  uint uVar7;
  undefined1 local_78 [8];
  AutoReuseOpnd autoReuseFirstArg;
  AutoReuseOpnd autoReuseArgInOpnd;
  
  bVar3 = Func::IsInlinee(callInstr->m_func);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x548c,"(callInstr->m_func->IsInlinee())","callInstr->m_func->IsInlinee()");
    if (!bVar3) goto LAB_0057e2ca;
    *puVar4 = 0;
  }
  this_00 = callInstr->m_func;
  uVar1 = this_00->actualCount;
  uVar7 = uVar1 - 1;
  if (0xe < uVar7) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x548f,"(actualCount < Js::InlineeCallInfo::MaxInlineeArgoutCount)",
                       "actualCount < Js::InlineeCallInfo::MaxInlineeArgoutCount");
    if (!bVar3) {
LAB_0057e2ca:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  pSVar5 = Func::GetInlineeArgvSlotOpnd(this_00);
  stackSym = Sym::AsStackSym(pSVar5->m_sym);
  Func::SetArgOffset(this->m_func,stackSym,stackSym->m_offset + 8);
  pSVar5 = IR::SymOpnd::New(&stackSym->super_Sym,TyUint64,this_00);
  IR::AutoReuseOpnd::AutoReuseOpnd((AutoReuseOpnd *)local_78,&pSVar5->super_Opnd,this_00,true);
  dst = IR::RegOpnd::New(TyInt64,this_00);
  IR::AutoReuseOpnd::AutoReuseOpnd
            ((AutoReuseOpnd *)&autoReuseFirstArg.autoDelete,&dst->super_Opnd,this_00,true);
  InsertLea(dst,&pSVar5->super_Opnd,callInstr);
  offset = (uint)uVar1 * 8 + -0x10;
  for (; uVar7 != 0; uVar7 = uVar7 - 1) {
    newSrc = IR::IndirOpnd::New(dst,offset,TyInt64,this_00,false);
    this_01 = IR::Instr::New(ArgOut_A_Dynamic,this_00);
    IR::Instr::SetSrc1(this_01,&newSrc->super_Opnd);
    IR::Instr::InsertBefore(callInstr,this_01);
    LowererMDArch::LoadDynamicArgument(&(this->m_lowererMD).lowererMDArch,this_01,uVar7 + 3);
    offset = offset + -8;
  }
  pIVar6 = IR::IntConstOpnd::New((ulong)this_00->actualCount,TyInt64,this_00,false);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&autoReuseFirstArg.autoDelete);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_78);
  return &pIVar6->super_Opnd;
}

Assistant:

IR::Opnd*
Lowerer::GenerateArgOutForInlineeStackArgs(IR::Instr* callInstr, IR::Instr* stackArgsInstr)
{
    Assert(callInstr->m_func->IsInlinee());
    Func *func = callInstr->m_func;
    uint32 actualCount = func->actualCount - 1; // don't count this pointer
    Assert(actualCount < Js::InlineeCallInfo::MaxInlineeArgoutCount);

    const auto firstRealArgStackSym = func->GetInlineeArgvSlotOpnd()->m_sym->AsStackSym();
    this->m_func->SetArgOffset(firstRealArgStackSym, firstRealArgStackSym->m_offset + MachPtr); //Start after this pointer
    IR::SymOpnd *firstArg = IR::SymOpnd::New(firstRealArgStackSym, TyMachPtr, func);
    const IR::AutoReuseOpnd autoReuseFirstArg(firstArg, func);
    IR::RegOpnd* argInOpnd = IR::RegOpnd::New(TyMachReg, func);
    const IR::AutoReuseOpnd autoReuseArgInOpnd(argInOpnd, func);
    InsertLea(argInOpnd, firstArg, callInstr);

    IR::IndirOpnd *argIndirOpnd = nullptr;
    IR::Instr* argout = nullptr;

#if defined(_M_IX86)
    // Maintain alignment
    if ((actualCount & 1) == 0)
    {
        IR::Instr *alignPush = IR::Instr::New(Js::OpCode::PUSH, this->m_func);
        alignPush->SetSrc1(IR::IntConstOpnd::New(1, TyInt32, this->m_func));
        callInstr->InsertBefore(alignPush);
    }
#endif

    for(uint i = actualCount; i > 0; i--)
    {
        argIndirOpnd = IR::IndirOpnd::New(argInOpnd, (i - 1) * MachPtr, TyMachReg, func);
        argout = IR::Instr::New(Js::OpCode::ArgOut_A_Dynamic, func);
        argout->SetSrc1(argIndirOpnd);
        callInstr->InsertBefore(argout);
        // i represents ith arguments from actuals, with is i + 3 counting this, callInfo and function object
        this->m_lowererMD.LoadDynamicArgument(argout, i + 3);
    }
    return IR::IntConstOpnd::New(func->actualCount, TyMachReg, func);
}